

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteFixed32
               (int field_number,uint32 value,CodedOutputStream *output)

{
  WriteTag(field_number,WIRETYPE_FIXED32,output);
  io::CodedOutputStream::WriteLittleEndian32(output,value);
  return;
}

Assistant:

void WireFormatLite::WriteFixed32(int field_number, uint32 value,
                                  io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED32, output);
  WriteFixed32NoTag(value, output);
}